

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_fun.c
# Opt level: O1

void ex_min(t_expr *e,long argc,ex_ex *argv,ex_ex *optr)

{
  int iVar1;
  t_float *ptVar2;
  t_float *ptVar3;
  t_float *ptVar4;
  long lVar5;
  char *fmt;
  long lVar6;
  float fVar7;
  float fVar8;
  double dVar9;
  
  lVar5 = argv->ex_type;
  if (lVar5 - 0xeU < 2) {
    if (optr->ex_type != 0xf) {
      if (optr->ex_type == 0xe) {
LAB_00198dd6:
        post("expr~: Int. error %d",0x205);
        abort();
      }
      optr->ex_type = 0xf;
      ptVar4 = (t_float *)malloc((long)e->exp_vsize << 2);
      (optr->ex_cont).v_vec = ptVar4;
    }
    ptVar4 = (optr->ex_cont).v_vec;
    ptVar3 = (argv->ex_cont).v_vec;
    lVar5 = argv[1].ex_type;
    if (lVar5 - 0xeU < 2) {
      iVar1 = e->exp_vsize;
      if (iVar1 == 0) {
        return;
      }
      ptVar2 = argv[1].ex_cont.v_vec;
      lVar5 = 0;
      do {
        fVar7 = ptVar2[lVar5];
        if (ptVar3[lVar5] <= ptVar2[lVar5]) {
          fVar7 = ptVar3[lVar5];
        }
        ptVar4[lVar5] = fVar7;
        lVar5 = lVar5 + 1;
      } while (iVar1 != (int)lVar5);
      return;
    }
    if (lVar5 == 2) {
      iVar1 = e->exp_vsize;
      if (iVar1 == 0) {
        return;
      }
      fVar7 = argv[1].ex_cont.v_flt;
      lVar5 = 0;
      do {
        fVar8 = fVar7;
        if (ptVar3[lVar5] <= fVar7) {
          fVar8 = ptVar3[lVar5];
        }
        ptVar4[lVar5] = fVar8;
        lVar5 = lVar5 + 1;
      } while (iVar1 != (int)lVar5);
      return;
    }
    if (lVar5 == 1) {
      iVar1 = e->exp_vsize;
      if (iVar1 == 0) {
        return;
      }
      lVar5 = argv[1].ex_cont.v_int;
      lVar6 = 0;
      do {
        fVar7 = (float)lVar5;
        if (ptVar3[lVar6] <= (float)lVar5) {
          fVar7 = ptVar3[lVar6];
        }
        ptVar4[lVar6] = fVar7;
        lVar6 = lVar6 + 1;
      } while (iVar1 != (int)lVar6);
      return;
    }
  }
  else if (lVar5 == 2) {
    lVar5 = argv[1].ex_type;
    if (lVar5 - 0xeU < 2) {
      if (optr->ex_type != 0xf) {
        if (optr->ex_type == 0xe) goto LAB_00198dd6;
        optr->ex_type = 0xf;
        ptVar4 = (t_float *)malloc((long)e->exp_vsize << 2);
        (optr->ex_cont).v_vec = ptVar4;
      }
      iVar1 = e->exp_vsize;
      if (iVar1 == 0) {
        return;
      }
      fVar7 = (argv->ex_cont).v_flt;
      ptVar4 = (optr->ex_cont).v_vec;
      ptVar3 = argv[1].ex_cont.v_vec;
      lVar5 = 0;
      do {
        fVar8 = ptVar3[lVar5];
        if (fVar7 <= ptVar3[lVar5]) {
          fVar8 = fVar7;
        }
        ptVar4[lVar5] = fVar8;
        lVar5 = lVar5 + 1;
      } while (iVar1 != (int)lVar5);
      return;
    }
    if (lVar5 == 2) {
      if (optr->ex_type == 0xf) {
        iVar1 = e->exp_vsize;
        if (iVar1 == 0) {
          return;
        }
        fVar7 = argv[1].ex_cont.v_flt;
        if ((argv->ex_cont).v_flt <= argv[1].ex_cont.v_flt) {
          fVar7 = (argv->ex_cont).v_flt;
        }
        ptVar4 = (optr->ex_cont).v_vec;
        lVar5 = 0;
        do {
          ptVar4[lVar5] = fVar7;
          lVar5 = lVar5 + 1;
        } while (iVar1 != (int)lVar5);
        return;
      }
      optr->ex_type = 2;
      fVar7 = argv[1].ex_cont.v_flt;
      if ((argv->ex_cont).v_flt <= argv[1].ex_cont.v_flt) {
        fVar7 = (argv->ex_cont).v_flt;
      }
      goto LAB_00198dcc;
    }
    if (lVar5 == 1) {
      if (optr->ex_type == 0xf) {
        fVar7 = (argv->ex_cont).v_flt;
        if ((float)argv[1].ex_cont.v_int < (argv->ex_cont).v_flt) {
          fVar7 = (float)argv[1].ex_cont.v_int;
        }
        iVar1 = e->exp_vsize;
        if (iVar1 == 0) {
          return;
        }
        ptVar4 = (optr->ex_cont).v_vec;
        lVar5 = 0;
        do {
          ptVar4[lVar5] = fVar7;
          lVar5 = lVar5 + 1;
        } while (iVar1 != (int)lVar5);
        return;
      }
      optr->ex_type = 2;
      fVar7 = (argv->ex_cont).v_flt;
      fVar8 = (float)argv[1].ex_cont.v_int;
      if (fVar7 <= fVar8) goto LAB_00198dcc;
      goto LAB_00198db0;
    }
  }
  else {
    if (lVar5 != 1) {
      fmt = "expr: FUNC_EVAL(%d): bad left type %ld\n";
      goto LAB_00198b88;
    }
    lVar5 = argv[1].ex_type;
    if (lVar5 - 0xeU < 2) {
      if (optr->ex_type != 0xf) {
        if (optr->ex_type == 0xe) goto LAB_00198dd6;
        optr->ex_type = 0xf;
        ptVar4 = (t_float *)malloc((long)e->exp_vsize << 2);
        (optr->ex_cont).v_vec = ptVar4;
      }
      iVar1 = e->exp_vsize;
      if (iVar1 == 0) {
        return;
      }
      lVar5 = (argv->ex_cont).v_int;
      ptVar4 = (optr->ex_cont).v_vec;
      ptVar3 = argv[1].ex_cont.v_vec;
      lVar6 = 0;
      do {
        fVar7 = ptVar3[lVar6];
        if ((float)lVar5 <= ptVar3[lVar6]) {
          fVar7 = (float)lVar5;
        }
        ptVar4[lVar6] = fVar7;
        lVar6 = lVar6 + 1;
      } while (iVar1 != (int)lVar6);
      return;
    }
    if (lVar5 == 2) {
      if (optr->ex_type == 0xf) {
        fVar7 = argv[1].ex_cont.v_flt;
        if ((float)(argv->ex_cont).v_int <= argv[1].ex_cont.v_flt) {
          fVar7 = (float)(argv->ex_cont).v_int;
        }
        iVar1 = e->exp_vsize;
        if (iVar1 == 0) {
          return;
        }
        ptVar4 = (optr->ex_cont).v_vec;
        lVar5 = 0;
        do {
          ptVar4[lVar5] = fVar7;
          lVar5 = lVar5 + 1;
        } while (iVar1 != (int)lVar5);
        return;
      }
      optr->ex_type = 2;
      fVar8 = (float)(argv->ex_cont).v_int;
      fVar7 = argv[1].ex_cont.v_flt;
      if (argv[1].ex_cont.v_flt < fVar8) goto LAB_00198dcc;
LAB_00198db0:
      fVar7 = fVar8;
LAB_00198dcc:
      (optr->ex_cont).v_flt = fVar7;
      return;
    }
    if (lVar5 == 1) {
      if (optr->ex_type != 0xf) {
        optr->ex_type = 1;
        dVar9 = (double)argv[1].ex_cont.v_int;
        if ((double)(argv->ex_cont).v_int <= (double)argv[1].ex_cont.v_int) {
          dVar9 = (double)(argv->ex_cont).v_int;
        }
        optr->ex_cont = (anon_union_8_5_735de1bb_for_ex_cont)(long)(int)dVar9;
        return;
      }
      iVar1 = e->exp_vsize;
      if (iVar1 == 0) {
        return;
      }
      dVar9 = (double)argv[1].ex_cont.v_int;
      if ((double)(argv->ex_cont).v_int <= (double)argv[1].ex_cont.v_int) {
        dVar9 = (double)(argv->ex_cont).v_int;
      }
      ptVar4 = (optr->ex_cont).v_vec;
      lVar5 = 0;
      do {
        ptVar4[lVar5] = (float)dVar9;
        lVar5 = lVar5 + 1;
      } while (iVar1 != (int)lVar5);
      return;
    }
  }
  fmt = "expr: FUNC_EVAL(%d): bad right type %ld\n";
LAB_00198b88:
  pd_error(e,fmt,0x205);
  return;
}

Assistant:

static void
ex_min(t_expr *e, long int argc, struct ex_ex *argv, struct ex_ex *optr)
{
        struct ex_ex *left, *right;
        t_float *op; /* output pointer */
        t_float *lp, *rp;         /* left and right vector pointers */
        t_float scalar;
        int j;

        left = argv++;
        right = argv;

        FUNC_EVAL(left, right, min, (double), (double), optr, 0);
}